

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall
OSTEI_HRR_Algorithm_Base::Create
          (OSTEI_HRR_Algorithm_Base *this,set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *am,
          RRStepType brasteptype,RRStepType ketsteptype)

{
  bool bVar1;
  const_iterator pvVar2;
  _Rb_tree_const_iterator<Quartet> __last;
  _Rb_tree_const_iterator<Quartet> __first;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<DAM>,_bool> pVar3;
  QuartetSet amquartets;
  QAM *it_4;
  iterator __end1_6;
  iterator __begin1_6;
  QAMSet *__range1_6;
  Doublet *it_3;
  iterator __end1_5;
  iterator __begin1_5;
  DoubletSet *__range1_5;
  Doublet *it_2;
  iterator __end1_4;
  iterator __begin1_4;
  DoubletSet *__range1_4;
  value_type *it2_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  array<Doublet,_2UL> *__range2_1;
  HRRDoubletStep *it_1;
  iterator __end1_3;
  iterator __begin1_3;
  HRRDoubletStepList *__range1_3;
  HRRDoubletStepList brasteps;
  DoubletSet add_targets_1;
  QAM *iam_1;
  iterator __end1_2;
  iterator __begin1_2;
  set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *__range1_2;
  DoubletSet prunedbra;
  DoubletSet solvedbras;
  DoubletSet initbras;
  value_type *it2;
  const_iterator __end2;
  const_iterator __begin2;
  array<Doublet,_2UL> *__range2;
  HRRDoubletStep *it;
  iterator __end1_1;
  iterator __begin1_1;
  HRRDoubletStepList *__range1_1;
  HRRDoubletStepList ketsteps;
  DoubletSet targets;
  DoubletSet add_targets;
  QAM *iam;
  iterator __end1;
  iterator __begin1;
  set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *__range1;
  DoubletSet prunedket;
  DoubletSet solvedkets;
  DoubletSet initkets;
  undefined4 in_stack_fffffffffffff888;
  int in_stack_fffffffffffff88c;
  QAM *in_stack_fffffffffffff890;
  __normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
  in_stack_fffffffffffff898;
  __normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
  in_stack_fffffffffffff8a0;
  value_type *in_stack_fffffffffffff8a8;
  set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *in_stack_fffffffffffff8b0;
  key_type *in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  _Rb_tree_const_iterator<DAM> in_stack_fffffffffffff8d8;
  long in_stack_fffffffffffff970;
  RRStepType steptype;
  DoubletSet *in_stack_fffffffffffff978;
  DoubletSet *in_stack_fffffffffffff980;
  DAM *in_stack_fffffffffffff988;
  DAM *am_00;
  QAM local_5e8;
  reference local_5b8;
  _Self local_5b0;
  _Self local_5a8;
  long local_5a0;
  undefined8 in_stack_fffffffffffffa98;
  RRStepType steptype_00;
  undefined1 in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffaa1;
  DoubletSet *in_stack_fffffffffffffaa8;
  DoubletSet *in_stack_fffffffffffffab0;
  HRRDoubletStepList *in_stack_fffffffffffffab8;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffffac0;
  _Self local_528;
  _Self local_520;
  undefined1 *local_518;
  _Base_ptr local_510;
  undefined1 in_stack_fffffffffffffaf8;
  undefined7 in_stack_fffffffffffffaf9;
  _Self local_4d0;
  _Self local_4c8;
  undefined1 *local_4c0;
  _Base_ptr local_4b8;
  undefined1 local_4b0;
  const_iterator local_458;
  const_iterator local_450;
  const_iterator local_448;
  array<Doublet,_2UL> *local_440;
  reference local_410;
  HRRDoubletStep *local_408;
  __normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
  local_400;
  undefined1 *local_3f8;
  HRRDoubletStep *local_3f0;
  HRRDoubletStep *local_3e8;
  undefined1 local_3e0 [24];
  _Base_ptr local_3c8;
  _Base_ptr local_3c0;
  allocator local_3b1;
  string local_3b0 [120];
  reference local_338;
  _Self local_330;
  _Self local_328 [8];
  undefined1 local_2e8 [96];
  _Base_ptr local_288;
  undefined1 in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd81;
  map<QAM,_DoubletType,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_DoubletType>_>_>
  *in_stack_fffffffffffffd88;
  QAMSet *in_stack_fffffffffffffd90;
  QAMList *in_stack_fffffffffffffd98;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffffda0;
  const_iterator local_218;
  __normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
  local_1d0;
  DAM *local_1c8;
  HRRDoubletStep *local_1c0;
  HRRDoubletStep *local_1b8;
  DAM local_1b0;
  _Base_ptr local_168;
  _Base_ptr local_160;
  allocator local_151;
  string local_150 [136];
  reference local_c8;
  _Self local_c0;
  _Self local_b8 [8];
  undefined1 local_78 [120];
  
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x133b2a);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x133b37);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x133b44);
  local_b8[0]._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  local_c0._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  while( true ) {
    bVar1 = std::operator!=(local_b8,&local_c0);
    if (!bVar1) break;
    local_c8 = std::_Rb_tree_const_iterator<QAM>::operator*
                         ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffff890);
    QAM::operator[](in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
    QAM::operator[](in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"",&local_151);
    DAM::DAM((DAM *)in_stack_fffffffffffff8a0._M_current,
             (int)((ulong)in_stack_fffffffffffff898._M_current >> 0x20),
             (int)in_stack_fffffffffffff898._M_current,(string *)in_stack_fffffffffffff890);
    GenerateDoubletTargets
              (in_stack_fffffffffffff988,(DoubletType)((ulong)in_stack_fffffffffffff980 >> 0x20));
    DAM::~DAM((DAM *)0x133c8c);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    local_160 = (_Base_ptr)
                std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::begin
                          ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                           CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    local_168 = (_Base_ptr)
                std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::end
                          ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                           CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    std::set<Doublet,std::less<Doublet>,std::allocator<Doublet>>::
    insert<std::_Rb_tree_const_iterator<Doublet>>
              ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
               in_stack_fffffffffffff890,
               (_Rb_tree_const_iterator<Doublet>)in_stack_fffffffffffff8a0._M_current,
               (_Rb_tree_const_iterator<Doublet>)in_stack_fffffffffffff898._M_current);
    std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
              ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x133d04);
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffff890);
  }
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)in_stack_fffffffffffff890
             ,(set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
              CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  PruneDoublets_(in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                 (RRStepType)((ulong)in_stack_fffffffffffff970 >> 0x20));
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::vector
            ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)0x133e0b);
  HRRDoubletLoop_(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                  in_stack_fffffffffffffaa8,
                  (DoubletSet *)CONCAT71(in_stack_fffffffffffffaa1,in_stack_fffffffffffffaa0),
                  (RRStepType)((ulong)in_stack_fffffffffffffa98 >> 0x20));
  am_00 = &local_1b0;
  local_1b8 = (HRRDoubletStep *)
              std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::begin
                        ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
                         CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  local_1c0 = (HRRDoubletStep *)
              std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::end
                        ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
                         CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  std::
  reverse<__gnu_cxx::__normal_iterator<HRRDoubletStep*,std::vector<HRRDoubletStep,std::allocator<HRRDoubletStep>>>>
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  local_1c8 = &local_1b0;
  local_1d0._M_current =
       (HRRDoubletStep *)
       std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::begin
                 ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::end
            ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
             CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
                        *)in_stack_fffffffffffff890,
                       (__normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
                        *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
    ::operator*(&local_1d0);
    in_stack_fffffffffffff980 = (DoubletSet *)(in_RDI + 0x1c0);
    Doublet::amlist((Doublet *)in_stack_fffffffffffff8d8._M_node);
    in_stack_fffffffffffff978 =
         (DoubletSet *)
         std::
         map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
         ::operator[]((map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                      in_stack_fffffffffffff8c8);
    std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::push_back
              ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
               in_stack_fffffffffffff8a0._M_current,in_stack_fffffffffffff898._M_current);
    DAM::~DAM((DAM *)0x133f6f);
    local_218 = std::array<Doublet,_2UL>::begin((array<Doublet,_2UL> *)0x133f90);
    pvVar2 = std::array<Doublet,_2UL>::end((array<Doublet,_2UL> *)0x133fa5);
    for (; local_218 != pvVar2; local_218 = local_218 + 1) {
      in_stack_fffffffffffff970 = in_RDI + 0x220;
      Doublet::amlist((Doublet *)in_stack_fffffffffffff8d8._M_node);
      std::
      map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
      ::operator[]((map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                   in_stack_fffffffffffff8c8);
      Doublet::amlist((Doublet *)in_stack_fffffffffffff8d8._M_node);
      pVar3 = std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::insert
                        (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
      local_288 = (_Base_ptr)pVar3.first._M_node;
      in_stack_fffffffffffffd80 = pVar3.second;
      DAM::~DAM((DAM *)0x13408b);
      DAM::~DAM((DAM *)0x134098);
    }
    __gnu_cxx::
    __normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
    ::operator++(&local_1d0);
  }
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134173);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134180);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x13418d);
  local_328[0]._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  local_330._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  while( true ) {
    bVar1 = std::operator!=(local_328,&local_330);
    steptype_00 = (RRStepType)((ulong)in_stack_fffffffffffffa98 >> 0x20);
    steptype = (RRStepType)((ulong)in_stack_fffffffffffff970 >> 0x20);
    if (!bVar1) break;
    local_338 = std::_Rb_tree_const_iterator<QAM>::operator*
                          ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffff890);
    QAM::operator[](in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
    QAM::operator[](in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b0,"",&local_3b1);
    DAM::DAM((DAM *)in_stack_fffffffffffff8a0._M_current,
             (int)((ulong)in_stack_fffffffffffff898._M_current >> 0x20),
             (int)in_stack_fffffffffffff898._M_current,(string *)in_stack_fffffffffffff890);
    GenerateDoubletTargets(am_00,(DoubletType)((ulong)in_stack_fffffffffffff980 >> 0x20));
    DAM::~DAM((DAM *)0x1342cf);
    std::__cxx11::string::~string(local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    local_3c0 = (_Base_ptr)
                std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::begin
                          ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                           CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    local_3c8 = (_Base_ptr)
                std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::end
                          ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                           CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    std::set<Doublet,std::less<Doublet>,std::allocator<Doublet>>::
    insert<std::_Rb_tree_const_iterator<Doublet>>
              ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
               in_stack_fffffffffffff890,
               (_Rb_tree_const_iterator<Doublet>)in_stack_fffffffffffff8a0._M_current,
               (_Rb_tree_const_iterator<Doublet>)in_stack_fffffffffffff898._M_current);
    std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
              ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134347);
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffff890);
  }
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::operator=
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)in_stack_fffffffffffff890
             ,(set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
              CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  PruneDoublets_(in_stack_fffffffffffff980,in_stack_fffffffffffff978,steptype);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::vector
            ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)0x13444e);
  HRRDoubletLoop_(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                  in_stack_fffffffffffffaa8,
                  (DoubletSet *)CONCAT71(in_stack_fffffffffffffaa1,in_stack_fffffffffffffaa0),
                  steptype_00);
  local_3e8 = (HRRDoubletStep *)
              std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::begin
                        ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
                         CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  local_3f0 = (HRRDoubletStep *)
              std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::end
                        ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
                         CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  std::
  reverse<__gnu_cxx::__normal_iterator<HRRDoubletStep*,std::vector<HRRDoubletStep,std::allocator<HRRDoubletStep>>>>
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  local_3f8 = local_3e0;
  local_400._M_current =
       (HRRDoubletStep *)
       std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::begin
                 ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  local_408 = (HRRDoubletStep *)
              std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::end
                        ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
                         CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
                        *)in_stack_fffffffffffff890,
                       (__normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
                        *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    if (!bVar1) break;
    local_410 = __gnu_cxx::
                __normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
                ::operator*(&local_400);
    Doublet::amlist((Doublet *)in_stack_fffffffffffff8d8._M_node);
    std::
    map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
    ::operator[]((map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                 in_stack_fffffffffffff8c8);
    std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::push_back
              ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
               in_stack_fffffffffffff8a0._M_current,in_stack_fffffffffffff898._M_current);
    DAM::~DAM((DAM *)0x1345b2);
    local_440 = &local_410->src;
    local_448 = std::array<Doublet,_2UL>::begin((array<Doublet,_2UL> *)0x1345d3);
    local_450 = std::array<Doublet,_2UL>::end((array<Doublet,_2UL> *)0x1345e8);
    for (; local_448 != local_450; local_448 = local_448 + 1) {
      local_458 = local_448;
      Doublet::amlist((Doublet *)in_stack_fffffffffffff8d8._M_node);
      std::
      map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
      ::operator[]((map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                   in_stack_fffffffffffff8c8);
      Doublet::amlist((Doublet *)in_stack_fffffffffffff8d8._M_node);
      pVar3 = std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::insert
                        (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
      local_4b8 = (_Base_ptr)pVar3.first._M_node;
      local_4b0 = pVar3.second;
      DAM::~DAM((DAM *)0x1346b6);
      DAM::~DAM((DAM *)0x1346c3);
    }
    __gnu_cxx::
    __normal_iterator<HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
    ::operator++(&local_400);
  }
  local_4c0 = local_2e8;
  local_4c8._M_node =
       (_Base_ptr)
       std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::begin
                 ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  local_4d0._M_node =
       (_Base_ptr)
       std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::end
                 ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  while( true ) {
    bVar1 = std::operator!=(&local_4c8,&local_4d0);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<Doublet>::operator*
              ((_Rb_tree_const_iterator<Doublet> *)in_stack_fffffffffffff890);
    Doublet::amlist((Doublet *)in_stack_fffffffffffff8d8._M_node);
    pVar3 = std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::insert
                      (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    in_stack_fffffffffffff8d8 = pVar3.first._M_node;
    in_stack_fffffffffffffaf8 = pVar3.second;
    local_510 = in_stack_fffffffffffff8d8._M_node;
    DAM::~DAM((DAM *)0x134854);
    std::_Rb_tree_const_iterator<Doublet>::operator++
              ((_Rb_tree_const_iterator<Doublet> *)in_stack_fffffffffffff890);
  }
  local_518 = local_78;
  local_520._M_node =
       (_Base_ptr)
       std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::begin
                 ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  local_528._M_node =
       (_Base_ptr)
       std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::end
                 ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  while( true ) {
    bVar1 = std::operator!=(&local_520,&local_528);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<Doublet>::operator*
              ((_Rb_tree_const_iterator<Doublet> *)in_stack_fffffffffffff890);
    Doublet::amlist((Doublet *)in_stack_fffffffffffff8d8._M_node);
    std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::insert
              (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    DAM::~DAM((DAM *)0x134968);
    std::_Rb_tree_const_iterator<Doublet>::operator++
              ((_Rb_tree_const_iterator<Doublet> *)in_stack_fffffffffffff890);
  }
  __first._M_node = (_Base_ptr)(in_RDI + 0x2b0);
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffff890,
             (set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
             CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  AMOrder_AddWithDependencies_
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd88,
             (QAMSet *)CONCAT71(in_stack_fffffffffffffd81,in_stack_fffffffffffffd80));
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x134a1b);
  local_5a0 = in_RDI + 0x280;
  local_5a8._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  local_5b0._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  while( true ) {
    bVar1 = std::operator!=(&local_5a8,&local_5b0);
    if (!bVar1) break;
    local_5b8 = std::_Rb_tree_const_iterator<QAM>::operator*
                          ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffff890);
    QAM::QAM(in_stack_fffffffffffff890,
             (QAM *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    GenerateQuartetTargets((QAM *)CONCAT71(in_stack_fffffffffffffaf9,in_stack_fffffffffffffaf8));
    QAM::~QAM((QAM *)0x134ac9);
    __last._M_node = (_Base_ptr)(in_RDI + 0x250);
    in_stack_fffffffffffff890 = &local_5e8;
    std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::begin
              ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
               CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::end
              ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
               CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    std::set<Quartet,std::less<Quartet>,std::allocator<Quartet>>::
    insert<std::_Rb_tree_const_iterator<Quartet>>
              ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
               in_stack_fffffffffffff890,__first,__last);
    std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
              ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x134b31);
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffff890);
  }
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector
            ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)__first._M_node);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134bcc);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134bd9);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134be6);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector
            ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)__first._M_node);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134c00);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134c0d);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134c1a);
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134c27);
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(std::set<QAM> am,
                                      RRStepType brasteptype,
                                      RRStepType ketsteptype)
{
    // we need the kets from the original targets
    DoubletSet initkets, solvedkets, prunedket;

    for(auto & iam : am)
    {
        // strip of the tag here
        auto add_targets = GenerateDoubletTargets({iam[2],iam[3]}, DoubletType::KET);
        initkets.insert(add_targets.begin(), add_targets.end());
    }

    DoubletSet targets = initkets;
    PruneDoublets_(targets, prunedket, ketsteptype);

    //std::cout << "\n\n";
    //PrintDoubletSet(targets, "Initial ket targets");

    // Solve the ket part
    HRRDoubletStepList ketsteps;
    HRRDoubletLoop_(ketsteps, targets, solvedkets, prunedket, ketsteptype);
    std::reverse(ketsteps.begin(), ketsteps.end());

    // store in map by AM
    // and store requirements
    for(const auto & it : ketsteps)
    {
        ketsteps_[it.target.amlist()].push_back(it);
        for(const auto & it2 : it.src)
            ketreq_[it.target.amlist()].insert(it2.amlist());
    }
    

    /*
    std::cout << "\n\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    std::cout << "KET HRR step done.\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    for(const auto & it : ketsteps_)
    for(const auto & it2 : it.second)
        std::cout << it2 << "\n";
    */


    // we need the bras from the original targets
    DoubletSet initbras, solvedbras, prunedbra;
    for(auto & iam : am)
    {
        // this strips off the tag
        auto add_targets = GenerateDoubletTargets({iam[0],iam[1]}, DoubletType::BRA);
        initbras.insert(add_targets.begin(), add_targets.end());
    }


    // Initial bra targets
    targets = initbras;
    PruneDoublets_(targets, prunedbra, brasteptype);

    //std::cout << "\n\n";
    //PrintDoubletSet(targets, "Initial bra targets");

    // Solve the bra part
    HRRDoubletStepList brasteps;
    HRRDoubletLoop_(brasteps, targets, solvedbras, prunedbra, brasteptype);
    std::reverse(brasteps.begin(), brasteps.end());

    // store in map by AM
    // and store requirements
    for(const auto & it : brasteps)
    {
        brasteps_[it.target.amlist()].push_back(it);
        for(const auto & it2 : it.src)
            brareq_[it.target.amlist()].insert(it2.amlist());
    }


    /*
    std::cout << "\n\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    std::cout << "BRA HRR step done.\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    for(const auto & it : brasteps_)
    for(const auto & it2 : it.second)
        std::cout << it2 << "\n";
    */

    // solved info
    for(const auto & it : solvedbras)
        allbraam_.insert(it.amlist());
    for(const auto & it : solvedkets)
        allketam_.insert(it.amlist());

    // Put am in the order of calculation
    AMOrder_AddWithDependencies_(amorder_, topqam_, stepmap_, am);

    // form the top quartets
    for(auto & it : topqam_)
    {
        auto amquartets = GenerateQuartetTargets(it);
        topquartets_.insert(amquartets.begin(), amquartets.end());
    }

    //PrintQuartetSet(topquartets_, "HRR top quartets");
}